

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.h
# Opt level: O2

void __thiscall
QXmlStreamAttribute::QXmlStreamAttribute(QXmlStreamAttribute *this,QXmlStreamAttribute *param_1)

{
  QArrayDataPointer<char16_t>::QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)this,(QArrayDataPointer<char16_t> *)param_1);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&(this->m_namespaceUri).m_string,&(param_1->m_namespaceUri).m_string);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&(this->m_qualifiedName).m_string,&(param_1->m_qualifiedName).m_string);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&(this->m_value).m_string,&(param_1->m_value).m_string);
  this->field_0x60 = this->field_0x60 & 0xfe | param_1->field_0x60 & 1;
  return;
}

Assistant:

class Q_CORE_EXPORT QXmlStreamAttribute {
    QtPrivate::QXmlString m_name, m_namespaceUri, m_qualifiedName, m_value;
    uint m_isDefault : 1;
    friend class QXmlStreamReaderPrivate;
    friend class QXmlStreamAttributes;
public:
    QXmlStreamAttribute();
    QXmlStreamAttribute(const QString &qualifiedName, const QString &value);
    QXmlStreamAttribute(const QString &namespaceUri, const QString &name, const QString &value);

    inline QStringView namespaceUri() const { return m_namespaceUri; }
    inline QStringView name() const { return m_name; }
    inline QStringView qualifiedName() const { return m_qualifiedName; }
    inline QStringView prefix() const {
        return QStringView(m_qualifiedName).left(qMax(0, m_qualifiedName.size() - m_name.size() - 1));
    }
    inline QStringView value() const { return m_value; }
    inline bool isDefault() const { return m_isDefault; }
#if QT_CORE_REMOVED_SINCE(6, 8)
    inline bool operator==(const QXmlStreamAttribute &other) const
    { return comparesEqual(*this, other); }
    inline bool operator!=(const QXmlStreamAttribute &other) const
    { return !operator==(other); }
#endif

private:
    friend bool comparesEqual(const QXmlStreamAttribute &lhs,
                              const QXmlStreamAttribute &rhs) noexcept
    {
        if (lhs.m_value != rhs.m_value)
            return false;
        if (lhs.m_namespaceUri.isNull())
            return lhs.m_qualifiedName == rhs.m_qualifiedName;
        return lhs.m_namespaceUri == rhs.m_namespaceUri
            && lhs.m_name == rhs.m_name;
    }